

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O3

void __thiscall embree::SubdivMesh::setNumTimeSteps(SubdivMesh *this,uint numTimeSteps)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  BufferView<embree::Vec3fa> *pBVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  BufferView<embree::Vec3fa> *pBVar11;
  ulong uVar12;
  ulong uVar13;
  ulong __n;
  long lVar14;
  ulong __new_size;
  
  __new_size = (ulong)numTimeSteps;
  uVar13 = (this->vertices).size_alloced;
  __n = uVar13;
  if ((uVar13 < __new_size) && (__n = __new_size, uVar12 = uVar13, uVar13 != 0)) {
    do {
      __n = uVar12 * 2 + (ulong)(uVar12 * 2 == 0);
      uVar12 = __n;
    } while (__n < __new_size);
  }
  uVar12 = (this->vertices).size_active;
  if (__new_size < uVar12) {
    lVar14 = __new_size * 0x38 + 0x30;
    uVar13 = __new_size;
    do {
      plVar3 = *(long **)((long)&(((this->vertices).items)->super_RawBufferView).ptr_ofs + lVar14);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0x18))();
        uVar12 = (this->vertices).size_active;
      }
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 + 0x38;
    } while (uVar13 < uVar12);
    uVar13 = (this->vertices).size_alloced;
    (this->vertices).size_active = __new_size;
    uVar12 = __new_size;
  }
  if (uVar13 == __n) {
    lVar14 = __new_size - uVar12;
    if (uVar12 <= __new_size && lVar14 != 0) {
      lVar10 = uVar12 * 0x38 + 0x30;
      do {
        pBVar4 = (this->vertices).items;
        puVar1 = (undefined8 *)((long)pBVar4 + lVar10 + -0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pBVar4 + lVar10 + -0x30);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)pBVar4 + lVar10 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar4 + lVar10 + -8) = 1;
        *(undefined4 *)((long)pBVar4 + lVar10 + -4) = 0;
        *(undefined8 *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar10) = 0;
        lVar10 = lVar10 + 0x38;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    (this->vertices).size_active = __new_size;
  }
  else {
    pBVar4 = (this->vertices).items;
    uVar13 = 0;
    pBVar11 = __gnu_cxx::new_allocator<embree::BufferView<embree::Vec3fa>_>::allocate
                        ((new_allocator<embree::BufferView<embree::Vec3fa>_> *)&this->vertices,__n,
                         (void *)0x0);
    (this->vertices).items = pBVar11;
    if ((this->vertices).size_active != 0) {
      lVar14 = 0x30;
      uVar12 = 0;
      do {
        pBVar11 = (this->vertices).items;
        puVar1 = (undefined8 *)((long)pBVar4 + lVar14 + -0x30);
        uVar5 = *puVar1;
        uVar6 = puVar1[1];
        puVar1 = (undefined8 *)((long)pBVar4 + lVar14 + -0x20);
        uVar7 = *puVar1;
        uVar8 = puVar1[1];
        puVar1 = (undefined8 *)((long)pBVar4 + lVar14 + -0x10);
        uVar9 = puVar1[1];
        puVar2 = (undefined8 *)((long)pBVar11 + lVar14 + -0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar9;
        puVar1 = (undefined8 *)((long)pBVar11 + lVar14 + -0x20);
        *puVar1 = uVar7;
        puVar1[1] = uVar8;
        puVar1 = (undefined8 *)((long)pBVar11 + lVar14 + -0x30);
        *puVar1 = uVar5;
        puVar1[1] = uVar6;
        *(undefined8 *)((long)&(pBVar11->super_RawBufferView).ptr_ofs + lVar14) =
             *(undefined8 *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar14);
        *(undefined8 *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar14) = 0;
        uVar12 = uVar12 + 1;
        uVar13 = (this->vertices).size_active;
        lVar14 = lVar14 + 0x38;
      } while (uVar12 < uVar13);
    }
    lVar14 = __new_size - uVar13;
    if (uVar13 <= __new_size && lVar14 != 0) {
      lVar10 = uVar13 * 0x38 + 0x30;
      do {
        pBVar11 = (this->vertices).items;
        puVar1 = (undefined8 *)((long)pBVar11 + lVar10 + -0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pBVar11 + lVar10 + -0x30);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)pBVar11 + lVar10 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar11 + lVar10 + -8) = 1;
        *(undefined4 *)((long)pBVar11 + lVar10 + -4) = 0;
        *(undefined8 *)((long)&(pBVar11->super_RawBufferView).ptr_ofs + lVar10) = 0;
        lVar10 = lVar10 + 0x38;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    operator_delete(pBVar4);
    (this->vertices).size_active = __new_size;
    (this->vertices).size_alloced = __n;
  }
  std::
  vector<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ::resize(&this->vertex_buffer_tags,__new_size);
  Geometry::setNumTimeSteps(&this->super_Geometry,numTimeSteps);
  return;
}

Assistant:

void SubdivMesh::setNumTimeSteps (unsigned int numTimeSteps)
  {
    vertices.resize(numTimeSteps);
    vertex_buffer_tags.resize(numTimeSteps);
    Geometry::setNumTimeSteps(numTimeSteps);
  }